

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall customUnits_uniqueness_Test::TestBody(customUnits_uniqueness_Test *this)

{
  int iVar1;
  bool bVar2;
  unit_data uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  char *message;
  int iVar11;
  uint uVar12;
  precise_unit cunit2;
  precise_unit cunit1;
  precise_unit cunit1inv;
  unsigned_short local_aa;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  internal local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  precise_unit local_70;
  AssertHelper local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  precise_unit local_50;
  precise_unit local_40;
  
  local_aa = 0;
  do {
    uVar3 = units::precise::custom::custom_unit(local_aa);
    local_50._8_8_ = ZEXT48((uint)uVar3);
    local_50.multiplier_ = 1.0;
    local_40.base_units_ = units::detail::unit_data::inv(&local_50.base_units_);
    uVar5 = ~local_50.commodity_;
    if (local_50.commodity_ == 0) {
      uVar5 = 0;
    }
    local_40.commodity_ = uVar5;
    uVar7 = ((int)local_50.base_units_ << 0x1c) >> 0x1c;
    uVar5 = -uVar7;
    if (0 < (int)uVar7) {
      uVar5 = uVar7;
    }
    uVar8 = (int)local_50.base_units_._0_1_ >> 4;
    uVar7 = -uVar8;
    if (0 < (int)uVar8) {
      uVar7 = uVar8;
    }
    uVar9 = ((int)local_50.base_units_ << 0x15) >> 0x1d;
    uVar8 = -uVar9;
    if (0 < (int)uVar9) {
      uVar8 = uVar9;
    }
    iVar11 = ((int)local_50.base_units_ << 0xd) >> 0x1d;
    iVar1 = -iVar11;
    if (0 < iVar11) {
      iVar1 = iVar11;
    }
    uVar12 = (int)local_50.base_units_._0_2_ >> 0xe;
    uVar9 = -uVar12;
    if (0 < (int)uVar12) {
      uVar9 = uVar12;
    }
    uVar4 = ((int)local_50.base_units_ << 6) >> 0x1e;
    uVar12 = -uVar4;
    if (0 < (int)uVar4) {
      uVar12 = uVar4;
    }
    local_40.multiplier_ = 1.0;
    local_70.multiplier_ =
         (double)CONCAT44(local_70.multiplier_._4_4_,
                          (uint)(uVar9 < 2) * 0x20 + (uint)(iVar1 == 3) * 0x10 +
                          ((uint)(((uint)local_50.base_units_ & 0x3800) == 0x2000) << 6 |
                           (uint)local_50.base_units_ >> 0x1a & 4 |
                           (uint)local_50.base_units_ >> 0x1c & 2 |
                           (uint)local_50.base_units_ >> 0x1e & 1 | (uint)(uVar5 < 4) << 8 |
                           (uint)(5 < uVar7) << 9 | (uint)(uVar8 < 2) << 7) + (uint)(1 < uVar12) * 8
                         );
    testing::internal::CmpHelperEQ<int,unsigned_short>
              ((internal *)local_90,"precise::custom::custom_unit_number(cunit1.base_units())","ii",
               (int *)&local_70,&local_aa);
    if (local_90[0] == '\0') {
      testing::Message::Message((Message *)&local_70);
      pcVar10 = "";
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,900,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
      if ((long *)local_70.multiplier_ != (long *)0x0) {
        (**(code **)(*(long *)local_70.multiplier_ + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    uVar7 = ((int)local_50.base_units_ << 0x1c) >> 0x1c;
    uVar5 = -uVar7;
    if (0 < (int)uVar7) {
      uVar5 = uVar7;
    }
    uVar8 = (int)local_50.base_units_._0_1_ >> 4;
    uVar7 = -uVar8;
    if (0 < (int)uVar8) {
      uVar7 = uVar8;
    }
    uVar9 = ((int)local_50.base_units_ << 0x15) >> 0x1d;
    uVar8 = -uVar9;
    if (0 < (int)uVar9) {
      uVar8 = uVar9;
    }
    iVar11 = ((int)local_50.base_units_ << 0xd) >> 0x1d;
    iVar1 = -iVar11;
    if (0 < iVar11) {
      iVar1 = iVar11;
    }
    uVar12 = (int)local_50.base_units_._0_2_ >> 0xe;
    uVar9 = -uVar12;
    if (0 < (int)uVar12) {
      uVar9 = uVar12;
    }
    uVar4 = ((int)local_50.base_units_ << 6) >> 0x1e;
    uVar12 = -uVar4;
    if (0 < (int)uVar4) {
      uVar12 = uVar4;
    }
    uVar5 = (uint)(((uint)local_50.base_units_ & 0x3800) == 0x2000) << 6 |
            (uint)local_50.base_units_ >> 0x1a & 4 |
            (uint)local_50.base_units_ >> 0x1c & 2 | (uint)local_50.base_units_ >> 0x1e & 1 |
            (uint)(uVar5 < 4) << 8 | (uint)(5 < uVar7) << 9 | (uint)(uVar8 < 2) << 7;
    pcVar10 = (char *)(ulong)uVar5;
    local_70.multiplier_ =
         (double)CONCAT44(local_70.multiplier_._4_4_,
                          (uint)(uVar9 < 2) * 0x20 + (uint)(iVar1 == 3) * 0x10 + uVar5 +
                          (uint)(1 < uVar12) * 8);
    testing::internal::CmpHelperEQ<int,unsigned_short>
              ((internal *)local_90,"precise::custom::custom_unit_number(cunit1.base_units())","ii",
               (int *)&local_70,&local_aa);
    if (local_90[0] == '\0') {
      testing::Message::Message((Message *)&local_70);
      message = "";
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x385,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
      if ((long *)local_70.multiplier_ != (long *)0x0) {
        (**(code **)(*(long *)local_70.multiplier_ + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    uVar6 = 0;
    do {
      if (uVar6 != local_aa) {
        uVar3 = units::precise::custom::custom_unit((uint16_t)uVar6);
        local_70._8_8_ = ZEXT48((uint)uVar3);
        local_70.multiplier_ = (double)&DAT_3ff0000000000000;
        bVar2 = units::precise_unit::operator==(&local_50,&local_70);
        local_a0[0] = (internal)!bVar2;
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_a0[0]) {
          testing::Message::Message((Message *)&local_a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),
                     "Error with false comparison 1 index ",0x24);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_90,local_a0,(AssertionResult *)"cunit1 == cunit2","true",
                     "false",pcVar10);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x38b,(char *)local_90);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (local_90 != (undefined1  [8])&local_80) {
            operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
          }
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
          if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_98,local_98);
          }
        }
        local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(1.0 / local_70.multiplier_);
        uVar3 = units::detail::unit_data::inv(&local_70.base_units_);
        uVar5 = ~local_70.commodity_;
        if (local_70.commodity_ == 0) {
          uVar5 = 0;
        }
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar5,uVar3);
        local_90 = (undefined1  [8])local_58;
        bVar2 = units::precise_unit::operator==(&local_50,(precise_unit *)local_90);
        local_a0[0] = (internal)!bVar2;
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_a0[0]) {
          testing::Message::Message((Message *)&local_a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),
                     "Error with false comparison 1 inv index ",0x28);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_90,local_a0,(AssertionResult *)"cunit1 == cunit2.inv()","true",
                     "false",pcVar10);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x38d,(char *)local_90);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (local_90 != (undefined1  [8])&local_80) {
            operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
          }
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
          if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_98,local_98);
          }
        }
        bVar2 = units::precise_unit::operator==(&local_40,&local_70);
        local_a0[0] = (internal)!bVar2;
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_a0[0]) {
          testing::Message::Message((Message *)&local_a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),
                     "Error with false inv comparison 2 index ",0x28);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_90,local_a0,(AssertionResult *)"cunit1inv == cunit2","true",
                     "false",pcVar10);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x390,(char *)local_90);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (local_90 != (undefined1  [8])&local_80) {
            operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
          }
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
          if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_98,local_98);
          }
        }
        local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(1.0 / local_70.multiplier_);
        uVar3 = units::detail::unit_data::inv(&local_70.base_units_);
        uVar5 = ~local_70.commodity_;
        if (local_70.commodity_ == 0) {
          uVar5 = 0;
        }
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar5,uVar3);
        local_90 = (undefined1  [8])local_58;
        bVar2 = units::precise_unit::operator==(&local_40,(precise_unit *)local_90);
        local_a0[0] = (internal)!bVar2;
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_a0[0]) {
          testing::Message::Message((Message *)&local_a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),
                     "Error with false inv comparison 2 inv index ",0x2c);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_a8._M_head_impl + 0x10),",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_a8._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_90,local_a0,(AssertionResult *)"cunit1inv == cunit2.inv()",
                     "true","false",pcVar10);
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x393,(char *)local_90);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (local_90 != (undefined1  [8])&local_80) {
            operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
          }
          if (local_a8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
          if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_98,local_98);
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x400);
    local_aa = local_aa + 1;
  } while (local_aa < 0x400);
  return;
}

Assistant:

TEST(customUnits, uniqueness)
{
    for (std::uint16_t ii = 0; ii < 1024; ++ii) {
        auto cunit1 = precise::generate_custom_unit(ii);
        auto cunit1inv = cunit1.inv();

        EXPECT_EQ(precise::custom::custom_unit_number(cunit1.base_units()), ii);
        EXPECT_EQ(precise::custom::custom_unit_number(cunit1.base_units()), ii);
        for (std::uint16_t jj = 0; jj < 1024; ++jj) {
            if (ii == jj) {
                continue;
            }
            auto cunit2 = precise::generate_custom_unit(jj);
            EXPECT_FALSE(cunit1 == cunit2)
                << "Error with false comparison 1 index " << ii << "," << jj;
            EXPECT_FALSE(cunit1 == cunit2.inv())
                << "Error with false comparison 1 inv index " << ii << ","
                << jj;
            EXPECT_FALSE(cunit1inv == cunit2)
                << "Error with false inv comparison 2 index " << ii << ","
                << jj;
            EXPECT_FALSE(cunit1inv == cunit2.inv())
                << "Error with false inv comparison 2 inv index " << ii << ","
                << jj;
        }
    }
}